

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::Append
          (FormatSinkImpl *this,size_t n,char c)

{
  FormatSinkImpl *__s;
  FormatSinkImpl *__s_00;
  size_t __n;
  string_view sVar1;
  
  if (n != 0) {
    this->size_ = this->size_ + n;
    __s = (FormatSinkImpl *)this->pos_;
    __n = (long)(this + 1) - (long)__s;
    __s_00 = __s;
    if (__n < n) {
      __s_00 = (FormatSinkImpl *)this->buf_;
      do {
        if (this + 1 != __s) {
          memset(__s,(uint)(byte)c,__n);
          this->pos_ = this->pos_ + __n;
        }
        n = n - __n;
        sVar1._M_len = (long)this->pos_ - (long)__s_00;
        sVar1._M_str = (char *)__s_00;
        (*(this->raw_).write_)((this->raw_).sink_,sVar1);
        this->pos_ = (char *)__s_00;
        __n = 0x400;
        __s = __s_00;
      } while (0x400 < n);
    }
    memset(__s_00,(uint)(byte)c,n);
    this->pos_ = this->pos_ + n;
  }
  return;
}

Assistant:

void Append(size_t n, char c) {
    if (n == 0) return;
    size_ += n;
    auto raw_append = [&](size_t count) {
      memset(pos_, c, count);
      pos_ += count;
    };
    while (n > Avail()) {
      n -= Avail();
      if (Avail() > 0) {
        raw_append(Avail());
      }
      Flush();
    }
    raw_append(n);
  }